

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
S2Builder::Graph::GetInEdgeIds
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *this)

{
  ulong uVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  long lVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  int iVar9;
  undefined1 auVar8 [16];
  int iVar10;
  int iVar13;
  undefined1 auVar12 [16];
  allocator_type local_29;
  undefined1 auVar11 [16];
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(int)((ulong)((long)(this->edges_->
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->edges_->
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 3),&local_29);
  auVar5 = _DAT_00245de0;
  auVar4 = _DAT_00240670;
  auVar3 = _DAT_00240660;
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    lVar7 = (long)__last._M_current - (long)__first._M_current;
    uVar1 = lVar7 - 4;
    auVar12._8_4_ = (int)uVar1;
    auVar12._0_8_ = uVar1;
    auVar12._12_4_ = (int)(uVar1 >> 0x20);
    auVar8._0_8_ = uVar1 >> 2;
    auVar8._8_8_ = auVar12._8_8_ >> 2;
    uVar6 = 0;
    auVar8 = auVar8 ^ _DAT_00240670;
    do {
      iVar10 = (int)uVar6;
      auVar11._8_4_ = iVar10;
      auVar11._0_8_ = uVar6;
      auVar11._12_4_ = (int)(uVar6 >> 0x20);
      auVar12 = (auVar11 | auVar3) ^ auVar4;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar9 && auVar8._0_4_ < auVar12._0_4_ || iVar9 < auVar12._4_4_)
                & 1)) {
        __first._M_current[uVar6] = iVar10;
      }
      if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
          auVar12._12_4_ <= auVar8._12_4_) {
        __first._M_current[uVar6 + 1] = iVar10 + 1;
      }
      auVar12 = (auVar11 | auVar5) ^ auVar4;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar9 && (iVar13 != iVar9 || auVar12._0_4_ <= auVar8._0_4_)) {
        __first._M_current[uVar6 + 2] = iVar10 + 2;
        __first._M_current[uVar6 + 3] = iVar10 + 3;
      }
      uVar6 = uVar6 + 4;
    } while (((uVar1 >> 2) + 4 & 0xfffffffffffffffc) != uVar6);
    lVar2 = 0x3f;
    if (lVar7 >> 2 != 0) {
      for (; (ulong)(lVar7 >> 2) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetInEdgeIds()const::__0>>
              (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:66:13)>
                )this);
    if (lVar7 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetInEdgeIds()const::__0>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:66:13)>
                  )this);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetInEdgeIds()const::__0>>
                (__first,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:66:13)>
                  )this);
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::Graph::GetInEdgeIds()const::__0>>
                  (__last_00,
                   (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:66:13)>
                    )this);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Graph::EdgeId> Graph::GetInEdgeIds() const {
  vector<EdgeId> in_edge_ids(num_edges());
  std::iota(in_edge_ids.begin(), in_edge_ids.end(), 0);
  std::sort(in_edge_ids.begin(), in_edge_ids.end(),
            [this](EdgeId ai, EdgeId bi) {
      return StableLessThan(reverse(edge(ai)), reverse(edge(bi)), ai, bi);
    });
  return in_edge_ids;
}